

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O2

Var Js::HelperMethodWrapper4
              (ScriptContext *scriptContext,void *origHelperAddr,Var arg1,Var arg2,Var arg3,Var arg4
              )

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var pvVar4;
  AutoRegisterIgnoreExceptionWrapper local_40;
  Var local_38;
  
  local_38 = arg4;
  if (origHelperAddr == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0x6a,"(origHelperAddr)","origHelperAddr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = AutoRegisterIgnoreExceptionWrapper::IsRegistered(scriptContext->threadContext);
  if (bVar2) {
    pvVar4 = (Var)(*(code *)origHelperAddr)(arg1,arg2,arg3,local_38);
    return pvVar4;
  }
  AutoRegisterIgnoreExceptionWrapper::AutoRegisterIgnoreExceptionWrapper
            (&local_40,scriptContext->threadContext);
  pvVar4 = (Var)(*(code *)origHelperAddr)(arg1,arg2,arg3,local_38);
  AutoRegisterIgnoreExceptionWrapper::~AutoRegisterIgnoreExceptionWrapper(&local_40);
  return pvVar4;
}

Assistant:

Var HelperMethodWrapper4(ScriptContext* scriptContext, void* origHelperAddr, Var arg1, Var arg2, Var arg3, Var arg4)
    {
        Assert(origHelperAddr);
        return HelperMethodWrapper(scriptContext, [=] {
            return ((OrigHelperMethod4)origHelperAddr)(arg1, arg2, arg3, arg4);
        });
    }